

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_no_thread.cpp
# Opt level: O1

MPP_RET mpp_dec_control_no_thread(MppDecImpl *dec,MpiCmd cmd,void *param)

{
  pthread_mutex_t *__mutex;
  MPP_RET MVar1;
  
  __mutex = (pthread_mutex_t *)dec->cmd_lock;
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_lock(__mutex);
  }
  dec->cmd_send = dec->cmd_send + 1;
  MVar1 = mpp_dec_proc_cfg(dec,cmd,param);
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_unlock(__mutex);
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_dec_control_no_thread(MppDecImpl *dec, MpiCmd cmd, void *param)
{
    // cmd_lock is used to sync all async operations
    AutoMutex auto_lock(dec->cmd_lock->mutex());

    dec->cmd_send++;
    return mpp_dec_proc_cfg(dec, cmd, param);
}